

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O1

void silent_dependent_async(size_t W)

{
  long *plVar1;
  code *pcVar2;
  double dVar3;
  pointer piVar4;
  undefined8 uVar5;
  char extraout_AL;
  bool bVar6;
  int iVar7;
  time_t tVar8;
  long lVar9;
  pointer pWVar10;
  vector<int,_std::allocator<int>_> *__range2;
  ulong __new_size;
  int *d;
  pointer pWVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar13;
  vector<int,_std::allocator<int>_> data;
  ResultBuilder DOCTEST_RB;
  Executor executor;
  vector<int,_std::allocator<int>_> local_248;
  undefined1 local_228 [16];
  Result local_218;
  undefined1 local_1f8 [16];
  char *local_1e8;
  undefined4 local_1e0;
  char *local_1d8;
  undefined2 local_1d0;
  condition_variable local_1c8;
  undefined7 uStack_1c7;
  char local_1b1;
  anon_union_24_2_13149d16_for_String_2 aStack_1b0;
  undefined1 local_198 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  undefined1 local_168 [184];
  size_t local_b0;
  
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  local_198._32_8_ = (__pthread_internal_list *)0x0;
  p_Stack_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor
            ((Executor *)local_168,W,(shared_ptr<tf::WorkerInterface> *)(local_198 + 0x20));
  if (p_Stack_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_170);
  }
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __new_size = 0;
  do {
    std::vector<int,_std::allocator<int>_>::resize(&local_248,__new_size);
    piVar4 = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    for (pWVar11 = (pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start; pWVar11 != (pointer)piVar4;
        pWVar11 = (pointer)&pWVar11->field_0x4) {
      iVar7 = rand();
      *(int *)pWVar11 = iVar7 % 1000 + -500;
    }
    local_1f8._0_8_ =
         local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_1f8._8_8_ =
         local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tf::Executor::
    silent_dependent_async<tf::DefaultTaskParams,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_sort_hpp:595:10),_tf::AsyncTask_*,_nullptr>
              ((Executor *)local_228,(DefaultTaskParams *)local_168,
               (anon_class_24_3_b5c2bc7a *)&local_218,(AsyncTask *)local_1f8,(AsyncTask *)0x0);
    uVar5 = local_228._0_8_;
    if ((void *)local_228._0_8_ != (void *)0x0) {
      lVar9 = local_228._0_8_ + 0x88;
      if (*(char *)(local_228._0_8_ + 0xc0) != '\b') {
        lVar9 = 0;
      }
      LOCK();
      plVar1 = (long *)(lVar9 + 0x28);
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if ((*plVar1 == 0) && ((void *)local_228._0_8_ != (void *)0x0)) {
        if (*(long *)(local_228._0_8_ + 0xd0) != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        if (*(Semaphores **)(uVar5 + 200) != (Semaphores *)0x0) {
          std::default_delete<tf::Node::Semaphores>::operator()
                    ((default_delete<tf::Node::Semaphores> *)(uVar5 + 200),
                     *(Semaphores **)(uVar5 + 200));
        }
        *(undefined8 *)(uVar5 + 200) = 0;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                             *)(uVar5 + 0x88));
        if (*(void **)(uVar5 + 0x48) != (void *)(uVar5 + 0x60)) {
          free(*(void **)(uVar5 + 0x48));
        }
        if (*(long **)(uVar5 + 8) != (long *)(uVar5 + 0x18)) {
          operator_delete(*(long **)(uVar5 + 8),*(long *)(uVar5 + 0x18) + 1);
        }
        operator_delete((void *)uVar5,0xd8);
      }
    }
    local_1f8._0_8_ = local_168 + 0x90;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1f8);
    local_1f8[8] = true;
    while (local_b0 != 0) {
      std::condition_variable::wait((unique_lock *)(local_168 + 0x60));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1f8);
    local_1c8 = (condition_variable)0x0;
    local_1b1 = '\x17';
    aStack_1b0.buf[0] = '\0';
    aStack_1b0.buf[0x17] = '\x17';
    local_1f8._0_8_ = *(undefined8 *)(doctest::detail::g_cs + 0x20);
    local_1f8._8_4_ = 0xc;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_sort.cpp";
    local_1e0 = 0x141;
    local_1d8 = "std::is_sorted(data.begin(), data.end())";
    local_1d0 = 1;
    local_198[0] = '\0';
    local_198._8_8_ = (long)"TracerPid:\t" + 0xb;
    local_198._16_8_ = (long)"TracerPid:\t" + 0xb;
    pWVar10 = (pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
    pWVar11 = (pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
    if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        pWVar10 = (pointer)&pWVar11->field_0x4;
        if (pWVar10 ==
            (pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) break;
        iVar7 = *(int *)pWVar11;
        pWVar11 = pWVar10;
      } while (iVar7 <= *(int *)pWVar10);
    }
    local_228._8_8_ =
         (ulong)(pWVar10 ==
                (pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) | 0xc00000000;
    doctest::detail::Expression_lhs::operator_cast_to_Result
              (&local_218,(Expression_lhs *)(local_228 + 8));
    doctest::String::operator=((String *)&aStack_1b0.data,&local_218.m_decomp);
    local_1d0 = CONCAT11(local_1d0._1_1_,local_218.m_passed) ^ 1;
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
    if ((local_218.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_218.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_218.m_decomp.field_0.data.ptr);
      uVar12 = extraout_XMM0_Da_00;
      uVar13 = extraout_XMM0_Db_00;
    }
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_1f8,(double)CONCAT44(uVar13,uVar12));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if ((char)local_1d0 == '\x01') {
      bVar6 = doctest::detail::checkIfShouldThrow(local_1f8._8_4_);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_1b0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_1b0._1_7_,aStack_1b0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_1b0._1_7_,aStack_1b0.buf[0]));
    }
    if ((local_1b1 < '\0') && ((void *)CONCAT71(uStack_1c7,local_1c8) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(uStack_1c7,local_1c8));
    }
    bVar6 = __new_size == 0;
    __new_size = __new_size * 10;
    if (bVar6) {
      __new_size = 1;
    }
    if (99999 < __new_size) {
      if ((pointer)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tf::Executor::~Executor((Executor *)local_168);
      return;
    }
  } while( true );
}

Assistant:

void silent_dependent_async(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));
  
  tf::Executor executor(W);
  std::vector<int> data;

  for(size_t n=0; n < 100000; n = (n ? n*10 : 1)) {
    
    data.resize(n);

    for(auto& d : data) {
      d = ::rand() % 1000 - 500;
    }
  
    executor.silent_dependent_async(tf::make_sort_task(data.begin(), data.end()));
    executor.wait_for_all();
    REQUIRE(std::is_sorted(data.begin(), data.end()));
  }
}